

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O1

string * mac2string_abi_cxx11_(string *__return_storage_ptr__,uint64_t mac)

{
  long lVar1;
  char cVar2;
  ostream *poVar3;
  ostringstream out;
  undefined1 auStack_198 [7];
  char local_191;
  long local_190 [2];
  undefined8 uStack_180;
  uint auStack_178 [22];
  ios_base local_120 [112];
  char acStack_b0 [152];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  *(uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18)) =
       *(uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18)) & 0xffffffb5 | 8;
  lVar1 = *(long *)(local_190[0] + -0x18);
  if (acStack_b0[lVar1 + 1] == '\0') {
    cVar2 = std::ios::widen((char)auStack_198 + (char)lVar1 + '\b');
    acStack_b0[lVar1] = cVar2;
    acStack_b0[lVar1 + 1] = '\x01';
  }
  acStack_b0[lVar1] = '0';
  *(undefined8 *)((long)&uStack_180 + *(long *)(local_190[0] + -0x18)) = 2;
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  local_191 = ':';
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_191,1);
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 2;
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  local_191 = ':';
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_191,1);
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 2;
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  local_191 = ':';
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_191,1);
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 2;
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  local_191 = ':';
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_191,1);
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 2;
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  local_191 = ':';
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_191,1);
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 2;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

inline std::string mac2string(const uint64_t mac)
{
  std::ostringstream out;

  out << std::hex << std::setfill('0');
  out << std::setw(2) << ((mac>>40)&0xff) << ':' << std::setw(2) << ((mac>>32)&0xff) << ':'
      << std::setw(2) << ((mac>>24)&0xff) << ':' << std::setw(2) << ((mac>>16)&0xff) << ':'
      << std::setw(2) << ((mac>>8)&0xff) << ':' << std::setw(2) << (mac&0xff);

  return out.str();
}